

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEnginePrivate::parseRequestMethodReply(QSocks5SocketEnginePrivate *this)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  QSocks5SocketEngine *this_00;
  qsizetype qVar5;
  QSocks5SocketEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int err;
  Socks5Error socks5Error;
  QSocks5SocketEngine *q;
  int pos;
  quint16 port;
  QHostAddress address;
  QByteArray inBuf;
  undefined4 in_stack_ffffffffffffff48;
  SocketState in_stack_ffffffffffffff4c;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QSocks5SocketEnginePrivate *pAddress;
  QByteArray *in_stack_ffffffffffffff80;
  Socks5Error in_stack_ffffffffffffffc0;
  Socks5State in_stack_ffffffffffffffc4;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  quint16 qVar6;
  Socks5State state;
  QSocks5SocketEnginePrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pAddress = in_RDI;
  this_00 = q_func(in_RDI);
  this_01 = (QSocks5SocketEnginePrivate *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x3713af);
  bVar2 = QSocks5Authenticator::unSeal
                    ((QSocks5Authenticator *)this_00,
                     (QTcpSocket *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     (QByteArray *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (!bVar2) goto LAB_003717b8;
  QByteArray::prepend((QByteArray *)&stack0xffffffffffffffe0);
  QByteArray::clear();
  qVar5 = QByteArray::size((QByteArray *)&stack0xffffffffffffffe0);
  if (qVar5 < 3) {
    QByteArray::operator=(&in_RDI->receivedHeaderFragment,(QByteArray *)&stack0xffffffffffffffe0);
    goto LAB_003717b8;
  }
  state = 0xaaaaaaaa;
  QHostAddress::QHostAddress((QHostAddress *)in_stack_ffffffffffffff50);
  qVar6 = 0;
  cVar3 = QByteArray::at((QByteArray *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                         ,0x371481);
  if ((cVar3 == '\x05') &&
     (cVar3 = QByteArray::at((QByteArray *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0x37149b)
     , cVar3 == '\0')) {
    cVar3 = QByteArray::at((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0x3714e2);
    if (cVar3 != '\0') {
      cVar3 = QByteArray::at((QByteArray *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0x3714fc)
      ;
      if (((cVar3 != '\x01') && (cVar3 != '\x02')) ||
         (bVar2 = QString::isEmpty((QString *)0x371522), bVar2)) {
        setErrorState(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
        ;
      }
      else {
        QString::QString((QString *)0x371530);
        setErrorState(this_01,state,(QString *)CONCAT26(qVar6,in_stack_ffffffffffffffd0));
        QString::~QString((QString *)0x37154e);
      }
      goto LAB_00371671;
    }
    iVar4 = qt_socks5_get_host_address_and_port
                      (in_stack_ffffffffffffff80,(QHostAddress *)pAddress,(quint16 *)this_00,
                       (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (iVar4 == -1) {
      QString::QString((QString *)0x3715a7);
      setErrorState(this_01,state,(QString *)CONCAT26(qVar6,in_stack_ffffffffffffffd0));
      QString::~QString((QString *)0x3715c5);
      goto LAB_00371671;
    }
    if (iVar4 != 0) {
      QByteArray::remove((longlong)&stack0xffffffffffffffe0,0);
      qVar5 = QByteArray::size((QByteArray *)&stack0xffffffffffffffe0);
      iVar4 = (int)qVar5;
      while (iVar4 = iVar4 + -1, -1 < iVar4) {
        in_stack_ffffffffffffff50 = (QSocks5SocketEnginePrivate *)in_RDI->data->controlSocket;
        QByteArray::at((QByteArray *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       0x37164f);
        QIODevice::ungetChar((char)in_stack_ffffffffffffff50);
      }
      goto LAB_00371671;
    }
    QByteArray::operator=(&in_RDI->receivedHeaderFragment,(QByteArray *)&stack0xffffffffffffffe0);
  }
  else {
    QString::QString((QString *)0x3714ad);
    setErrorState(this_01,state,(QString *)CONCAT26(qVar6,in_stack_ffffffffffffffd0));
    QString::~QString((QString *)0x3714cb);
LAB_00371671:
    if (in_RDI->socks5State == RequestMethodSent) {
      QHostAddress::operator=
                ((QHostAddress *)in_stack_ffffffffffffff50,
                 (QHostAddress *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      (in_RDI->super_QAbstractSocketEnginePrivate).localPort = qVar6;
      if (in_RDI->mode == ConnectMode) {
        (in_RDI->super_QAbstractSocketEnginePrivate).outboundStreamCount = 1;
        (in_RDI->super_QAbstractSocketEnginePrivate).inboundStreamCount = 1;
        in_RDI->socks5State = Connected;
        QAbstractSocketEngine::setState
                  ((QAbstractSocketEngine *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        emitConnectionNotification(in_stack_ffffffffffffff50);
      }
      else if (in_RDI->mode == BindMode) {
        in_RDI->socks5State = BindSuccess;
        QAbstractSocketEngine::setState
                  ((QAbstractSocketEngine *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      }
      else {
        in_RDI->socks5State = UdpAssociateSuccess;
      }
    }
    else if (in_RDI->socks5State == BindSuccess) {
      QHostAddress::operator=
                ((QHostAddress *)in_stack_ffffffffffffff50,
                 (QHostAddress *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      in_RDI->bindData->peerPort = qVar6;
      emitReadNotification(in_stack_ffffffffffffff50);
    }
    else {
      (**(code **)(*(long *)&in_RDI->data->controlSocket->super_QAbstractSocket + 0x70))();
      emitConnectionNotification(in_stack_ffffffffffffff50);
    }
  }
  QHostAddress::~QHostAddress((QHostAddress *)0x3717b8);
LAB_003717b8:
  QByteArray::~QByteArray((QByteArray *)0x3717c5);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::parseRequestMethodReply()
{
    Q_Q(QSocks5SocketEngine);
    QSOCKS5_DEBUG << "parseRequestMethodReply()";

    QByteArray inBuf;
    if (!data->authenticator->unSeal(data->controlSocket, &inBuf)) {
        // ### check error and not just not enough data
        QSOCKS5_DEBUG << "unSeal failed, needs more data";
        return;
    }

    inBuf.prepend(receivedHeaderFragment);
    receivedHeaderFragment.clear();
    QSOCKS5_DEBUG << dump(inBuf);
    if (inBuf.size() < 3) {
        QSOCKS5_DEBUG << "need more data for request reply header .. put this data somewhere";
        receivedHeaderFragment = inBuf;
        return;
    }

    QHostAddress address;
    quint16 port = 0;

    if (inBuf.at(0) != S5_VERSION_5 || inBuf.at(2) != 0x00) {
        QSOCKS5_DEBUG << "socks protocol error";
        setErrorState(SocksError);
    } else if (inBuf.at(1) != S5_SUCCESS) {
        Socks5Error socks5Error = Socks5Error(inBuf.at(1));
        QSOCKS5_DEBUG <<  "Request error :" << socks5Error;
        if ((socks5Error == SocksFailure || socks5Error == ConnectionNotAllowed)
            && !peerName.isEmpty()) {
            // Dante seems to use this error code to indicate hostname resolution failure
            setErrorState(HostNameLookupError);
        } else {
            setErrorState(RequestError, socks5Error);
        }
    } else {
        // connection success, retrieve the remote addresses
        int pos = 3;
        int err = qt_socks5_get_host_address_and_port(inBuf, &address, &port, &pos);
        if (err == -1) {
            QSOCKS5_DEBUG << "error getting address";
            setErrorState(SocksError);
        } else if (err == 0) {
            //need more data
            receivedHeaderFragment = inBuf;
            return;
        } else {
            inBuf.remove(0, pos);
            for (int i = inBuf.size() - 1; i >= 0 ; --i)
                data->controlSocket->ungetChar(inBuf.at(i));
        }
    }

    if (socks5State == RequestMethodSent) {
        // no error
        localAddress = address;
        localPort = port;

        if (mode == ConnectMode) {
            inboundStreamCount = outboundStreamCount = 1;
            socks5State = Connected;
            // notify the upper layer that we're done
            q->setState(QAbstractSocket::ConnectedState);
            emitConnectionNotification();
        } else if (mode == BindMode) {
            socks5State = BindSuccess;
            q->setState(QAbstractSocket::ListeningState);
        } else {
            socks5State = UdpAssociateSuccess;
        }
    } else if (socks5State == BindSuccess) {
        // no error and we got a connection
        bindData->peerAddress = address;
        bindData->peerPort = port;

        emitReadNotification();
    } else {
        // got an error
        data->controlSocket->close();
        emitConnectionNotification();
    }
}